

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
IDisk::GetCAT_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,IDisk *this,AutorunType *autorun_type,int user)

{
  bool bVar1;
  uchar uVar2;
  size_type sVar3;
  pointer paVar4;
  reference pvVar5;
  void *__s;
  byte local_186;
  string local_f8;
  allocator<char> local_d1;
  undefined1 local_d0 [8];
  string str;
  int local_a8;
  int iStack_a4;
  bool end;
  int offset;
  int hex;
  int line_count;
  uint uStack_94;
  uchar b;
  int cpt;
  int index;
  int nb_read_sector;
  uint index_sector;
  int nb_sector_read;
  int offset_data;
  uchar *track_data;
  iterator iStack_70;
  int total_size;
  __normal_iterator<IDisk::Sector_*,_std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>_>
  local_68;
  iterator it;
  uchar first_sector;
  int index_cat;
  undefined1 local_48 [8];
  Track track_info;
  int user_local;
  AutorunType *autorun_type_local;
  IDisk *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filename_vector;
  
  track_info.full_size_._3_1_ = 0;
  track_info.gap3_size_ = user;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  *autorun_type = AUTO_UNKNOWN;
  Track::Track((Track *)local_48);
  GetTrackInfo(this,0,0,(Track *)local_48);
  sVar3 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                    ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48);
  if (sVar3 != 0) {
    it._M_current._4_4_ = 0;
    it._M_current._3_1_ = 0;
    local_68._M_current =
         (anon_struct_36_14_4aa84ee9 *)
         std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::begin
                   ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48);
    while( true ) {
      iStack_70 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::end
                            ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48);
      bVar1 = __gnu_cxx::operator!=(&local_68,&stack0xffffffffffffff90);
      if (!bVar1) break;
      paVar4 = __gnu_cxx::
               __normal_iterator<IDisk::Sector_*,_std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>_>
               ::operator->(&local_68);
      if (paVar4->r == 'A') {
        it._M_current._4_4_ = 2;
      }
      __gnu_cxx::
      __normal_iterator<IDisk::Sector_*,_std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>_>
      ::operator++(&local_68);
    }
    pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                       ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48,0);
    if ((pvVar5->r & 0xc0) == 0x40) {
      it._M_current._3_1_ = 0x41;
      *autorun_type = AUTO_FILE;
    }
    else {
      pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                         ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48,0);
      if ((pvVar5->r & 0xc0) == 0xc0) {
        it._M_current._4_4_ = 0;
        it._M_current._3_1_ = 0xc1;
        *autorun_type = AUTO_FILE;
      }
      else {
        pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                           ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48,0);
        if (((pvVar5->r & 0xc0) == 0) ||
           (pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                               ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48,0)
           , (pvVar5->r & 0xc0) == 0x80)) {
          it._M_current._4_4_ = 1;
          it._M_current._3_1_ = 1;
          *autorun_type = AUTO_CPM;
        }
      }
    }
    if (it._M_current._4_4_ != 0) {
      std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::clear
                ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48);
      GetTrackInfo(this,0,it._M_current._4_4_,(Track *)local_48);
    }
    __s = operator_new__(0x800);
    memset(__s,0,0x800);
    index_sector = 0;
    index = 0;
    cpt = 0;
    while( true ) {
      sVar3 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                        ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48);
      bVar1 = false;
      if (((uint)index < sVar3) && (bVar1 = false, cpt < 4)) {
        bVar1 = (int)index_sector < 0x800;
      }
      if (!bVar1) break;
      pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                         ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48,
                          (ulong)(uint)index);
      if ((it._M_current._3_1_ <= pvVar5->r) &&
         (pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                             ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48,
                              (ulong)(uint)index),
         (int)((uint)pvVar5->r - (uint)it._M_current._3_1_) < 4)) {
        pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                           ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48,
                            (ulong)(uint)index);
        uStack_94 = pvVar5->dam_offset + 0x40;
        pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                           ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48,
                            (ulong)(uint)index);
        cpt = cpt + 1;
        index_sector = ((uint)pvVar5->r - (uint)it._M_current._3_1_) * 0x200;
        for (line_count = 0;
            pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                               ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_48,
                                (ulong)(uint)index),
            line_count < (int)(uint)pvVar5->real_size && (int)index_sector < 0x800;
            line_count = line_count + 1) {
          uVar2 = GetNextByte(this,0,it._M_current._4_4_,uStack_94);
          *(uchar *)((long)__s + (long)(int)index_sector) = uVar2;
          uStack_94 = uStack_94 + 0x10;
          index_sector = index_sector + 1;
        }
      }
      index = index + 1;
    }
    offset = 0;
    for (iStack_a4 = 0; iStack_a4 < (int)index_sector; iStack_a4 = iStack_a4 + 1) {
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 8))
                  (this->log_,*(undefined1 *)((long)__s + (long)iStack_a4));
      }
      if (this->log_ != (ILog *)0x0) {
        (*(code *)**(undefined8 **)this->log_)(this->log_," ");
      }
      offset = offset + 1;
      if (offset == 0x10) {
        if (this->log_ != (ILog *)0x0) {
          (**(code **)(*(long *)this->log_ + 0x20))();
        }
        offset = 0;
      }
    }
    local_a8 = 1;
    str.field_2._M_local_buf[0xf] = '\0';
    while( true ) {
      local_186 = 0;
      if (local_a8 < 0x800) {
        local_186 = str.field_2._M_local_buf[0xf] ^ 0xff;
      }
      if ((local_186 & 1) == 0) break;
      if ((track_info.gap3_size_ == -1) ||
         ((uint)*(byte *)((long)__s + (long)(local_a8 + -1)) == track_info.gap3_size_)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_d0,(char *)((long)__s + (long)local_a8),&local_d1);
        std::allocator<char>::~allocator(&local_d1);
        std::__cxx11::string::string((string *)&local_f8,(string *)local_d0);
        bVar1 = ValidName(&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        if (bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)local_d0);
        }
        std::__cxx11::string::~string((string *)local_d0);
      }
      local_a8 = local_a8 + 0x20;
    }
    if (__s != (void *)0x0) {
      operator_delete__(__s);
    }
  }
  track_info.full_size_._3_1_ = 1;
  Track::~Track((Track *)local_48);
  if ((track_info.full_size_._3_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>  IDisk::GetCAT(IDisk::AutorunType& autorun_type, int user)
{
   std::vector<std::string> filename_vector;
   autorun_type = IDisk::AUTO_UNKNOWN;

   // Get info
   IDisk::Track track_info;
   GetTrackInfo(0, 0, &track_info);

   if (track_info.list_sector_.size() == 0)
   {
      return filename_vector;
   }

   // CPM ?
   int index_cat = 0;
   unsigned char first_sector = 00;
   // A |CPM can be run if a"0x41" sector is found
   for (auto it = track_info.list_sector_.begin(); it != track_info.list_sector_.end(); ++it)
   {
      if (it->r == 0x41)
      {
         index_cat = 2;
      }
   }

   // SYSTEM / VENDOR
   if ((track_info.list_sector_.at(0).r & 0xC0) == 0x40)
   {
      first_sector = 0x41;
      autorun_type = IDisk::AUTO_FILE;
   }
   // DATA
   else if ((track_info.list_sector_.at(0).r & 0xC0) == 0xC0)
   {
      index_cat = 0;
      first_sector = 0xC1;
      autorun_type = IDisk::AUTO_FILE;
   }
   // IBM
   else if ((track_info.list_sector_.at(0).r & 0xC0) == 0x00
      || (track_info.list_sector_.at(0).r & 0xC0) == 0x80)
   {
      index_cat = 1;
      first_sector = 0x01;
      autorun_type = IDisk::AUTO_CPM;
   }

   if (index_cat != 0)
   {
      track_info.list_sector_.clear();
      GetTrackInfo(0, index_cat, &track_info);
   }

#define NB_SECTOR_FOR_CAT 4

   int total_size = NB_SECTOR_FOR_CAT * 512;
   /*for (int i = 0; i < NB_SECTOR_FOR_CAT && i < trackInfo.listSector.size(); i++)
   {
      totalSize += trackInfo.listSector.at(i).RealSize;
   }*/

   // No, try to fins appropriate file to run
   unsigned char* track_data = new unsigned char[total_size];
   memset(track_data, 0, total_size);
   int offset_data = 0;


   // It's in first track, NB_SECTOR_FOR_CAT firsts sectors, from first_sector to first_sector + NB_SECTOR_FOR_CAT
   // todo : read the proper sectors !
   int nb_sector_read = 0;

   //for (int i = 0; i < NB_SECTOR_FOR_CAT && i < trackInfo.listSector.size(); i++)
   unsigned int index_sector = 0;
   int nb_read_sector = 0;
   while (index_sector < track_info.list_sector_.size() && nb_read_sector < NB_SECTOR_FOR_CAT && offset_data < total_size)
   {
      // Read first xx sectors
      if (track_info.list_sector_.at(index_sector).r >= first_sector)
      {
         if (track_info.list_sector_.at(index_sector).r - first_sector < NB_SECTOR_FOR_CAT)
         {
            int index = track_info.list_sector_.at(index_sector).dam_offset + 64;

            offset_data = (track_info.list_sector_.at(index_sector).r - first_sector) * 512;
            nb_read_sector++;
            for (int cpt = 0; cpt < track_info.list_sector_.at(index_sector).real_size && offset_data < total_size; cpt++)
            {
               // Walk all of them - remove the 0x80 bits
               unsigned char b = GetNextByte(0, index_cat, index);
               track_data[offset_data++] = b;
               index += 16;
            }
         }
      }
      index_sector++;
   }

   // Dump TrackData
   int line_count = 0;
   for (int hex = 0; hex < offset_data; hex++)
   {
      LOGB(track_data[hex]);
      LOG(" ");
      if (++line_count == 16)
      {
         LOGEOL
            line_count = 0;
      }
   }

   int offset = 1;
   bool end = false;

   while (offset < total_size && !end)
   {
      if (user == -1 || track_data[offset - 1] == user)
      {
         // Add to the name vector
         std::string str = (const char*)(&track_data[offset]);
         if (ValidName(str))
         {
            filename_vector.push_back(str);
         }
      }
      offset += 32;
   }
   delete[]track_data;

   return filename_vector;
}